

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

void __thiscall
t_javame_generator::generate_primitive_service_interface
          (t_javame_generator *this,t_service *tservice)

{
  pointer pcVar1;
  t_function *tfunction;
  ostream *poVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Base_ptr *pp_Var5;
  size_type *psVar6;
  t_javame_generator *ptVar7;
  char *__end;
  string extends_iface;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string f_interface_name;
  ofstream_with_content_based_conditional_update f_iface;
  char *local_2b8;
  long local_2b0;
  char local_2a8 [16];
  undefined1 local_298 [32];
  string local_278;
  t_javame_generator *local_258;
  undefined1 local_250 [32];
  _Base_ptr *local_230;
  long local_228;
  _Base_ptr local_220;
  long lStack_218;
  string local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  char local_1e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [6];
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  t_generator::indent_abi_cxx11_((string *)&local_1d0,(t_generator *)this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_service_,(char *)local_1d0._M_allocated_capacity,
                      local_1d0._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"public interface Iface extends ",0x1f);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(this->super_t_oop_generator).super_t_generator.service_name_.
                             _M_dataplus._M_p,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Iface { }",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_allocated_capacity != local_1c0) {
    operator_delete((void *)local_1d0._M_allocated_capacity);
  }
  pcVar1 = (this->package_dir_)._M_dataplus._M_p;
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,pcVar1,pcVar1 + (this->package_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_2b8);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b8,
                              (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                     _M_dataplus._M_p);
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar4) {
    local_1c0[0]._0_8_ = paVar4->_M_allocated_capacity;
    local_1c0[0]._8_8_ = plVar3[3];
    local_1d0._M_allocated_capacity = (size_type)local_1c0;
  }
  else {
    local_1c0[0]._0_8_ = paVar4->_M_allocated_capacity;
    local_1d0._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar3;
  }
  local_1d0._8_8_ = plVar3[1];
  *plVar3 = (long)paVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1d0._M_local_buf);
  local_230 = &local_220;
  pp_Var5 = (_Base_ptr *)(plVar3 + 2);
  if ((_Base_ptr *)*plVar3 == pp_Var5) {
    local_220 = *pp_Var5;
    lStack_218 = plVar3[3];
  }
  else {
    local_220 = *pp_Var5;
    local_230 = (_Base_ptr *)*plVar3;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)pp_Var5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_allocated_capacity != local_1c0) {
    operator_delete((void *)local_1d0._M_allocated_capacity);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  std::__cxx11::string::string((string *)&local_2b8,(char *)local_230,(allocator *)&local_278);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0);
  local_140 = 0;
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  local_258 = this;
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_
              ((string *)local_250,this,&tservice->extends_->super_t_type,false,false,false);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x395650);
    ptVar7 = (t_javame_generator *)(plVar3 + 2);
    if ((t_javame_generator *)*plVar3 == ptVar7) {
      local_298._16_8_ = (ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator;
      local_298._24_8_ = plVar3[3];
      local_298._0_8_ = (t_javame_generator *)(local_298 + 0x10);
    }
    else {
      local_298._16_8_ = (ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator;
      local_298._0_8_ = (t_javame_generator *)*plVar3;
    }
    local_298._8_8_ = plVar3[1];
    *plVar3 = (long)ptVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_298);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_278.field_2._M_allocated_capacity = *psVar6;
      local_278.field_2._8_8_ = plVar3[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar6;
      local_278._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_278._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    this = local_258;
    if ((t_javame_generator *)local_298._0_8_ != (t_javame_generator *)(local_298 + 0x10)) {
      operator_delete((void *)local_298._0_8_);
    }
    if ((t_javame_generator *)local_250._0_8_ != (t_javame_generator *)(local_250 + 0x10)) {
      operator_delete((void *)local_250._0_8_);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_278,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,local_278._M_dataplus._M_p,local_278._M_string_length);
  java_package_abi_cxx11_((string *)local_298,this);
  ptVar7 = (t_javame_generator *)local_298._0_8_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_298._0_8_,local_298._8_8_);
  java_type_imports_abi_cxx11_((string *)local_250,ptVar7);
  ptVar7 = (t_javame_generator *)local_250._0_8_;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_250._0_8_,local_250._8_8_);
  java_thrift_imports_abi_cxx11_((string *)&local_1f0,ptVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1f0._0_8_,local_1f0._8_8_)
  ;
  if ((char *)local_1f0._0_8_ != local_1e0) {
    operator_delete((void *)local_1f0._0_8_);
  }
  if ((t_javame_generator *)local_250._0_8_ != (t_javame_generator *)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_);
  }
  if ((t_javame_generator *)local_298._0_8_ != (t_javame_generator *)(local_298 + 0x10)) {
    operator_delete((void *)local_298._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,&local_1d0,tservice);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d0,"public interface ",0x11)
  ;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,
                      (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p
                      ,(this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Iface",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2b8,local_2b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," {",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)local_298,&tservice->functions_)
  ;
  if (local_298._0_8_ != local_298._8_8_) {
    ptVar7 = (t_javame_generator *)local_298._0_8_;
    do {
      (*(local_258->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
                (local_258,&local_1d0,
                 (ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d0,"  public ",9);
      tfunction = (t_function *)(ptVar7->super_t_oop_generator).super_t_generator._vptr_t_generator;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"","");
      function_signature(&local_278,local_258,tfunction,&local_210);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1d0,local_278._M_dataplus._M_p,
                          local_278._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      ptVar7 = (t_javame_generator *)&(ptVar7->super_t_oop_generator).super_t_generator.keywords_;
    } while (ptVar7 != (t_javame_generator *)local_298._8_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1d0,"}",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_javame_generator *)local_298._0_8_ != (t_javame_generator *)0x0) {
    operator_delete((void *)local_298._0_8_);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)&local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  return;
}

Assistant:

void t_javame_generator::generate_primitive_service_interface(t_service* tservice) {
  f_service_ << indent() << "public interface Iface extends " << service_name_ << "Iface { }"
             << endl << endl;

  string f_interface_name = package_dir_ + "/" + service_name_ + "Iface.java";
  ofstream_with_content_based_conditional_update f_iface;
  f_iface.open(f_interface_name.c_str());

  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + type_name(tservice->get_extends()) + "Iface";
  }

  f_iface << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();
  generate_java_doc(f_iface, tservice);
  f_iface << "public interface " << service_name_ << "Iface" << extends_iface << " {" << endl
          << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_iface, *f_iter);
    f_iface << "  public " << function_signature(*f_iter) << ";" << endl << endl;
  }
  f_iface << "}" << endl << endl;
}